

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  ppIVar1 = &GImGui->CurrentWindow;
  GImGui->FocusRequestNextWindow = *ppIVar1;
  pIVar2->FocusRequestNextCounterAll = ((*ppIVar1)->DC).FocusCounterAll + offset + 1;
  pIVar2->FocusRequestNextCounterTab = 0x7fffffff;
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusRequestNextWindow = window;
    g.FocusRequestNextCounterAll = window->DC.FocusCounterAll + 1 + offset;
    g.FocusRequestNextCounterTab = INT_MAX;
}